

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

bool __thiscall
acto::core::anon_unknown_0::binding_context_t::process_actors
          (binding_context_t *this,bool need_delete)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  long *plVar3;
  _Hash_node_base *p_Var4;
  unordered_set<acto::core::object_t_*,_std::hash<acto::core::object_t_*>,_std::equal_to<acto::core::object_t_*>,_std::allocator<acto::core::object_t_*>_>
  *this_00;
  bool local_4c;
  long *local_48;
  long *local_40;
  binding_context_t *local_38;
  
  runtime_t::instance();
  p_Var4 = (this->actors)._M_h._M_before_begin._M_nxt;
  local_38 = this;
  if (p_Var4 == (_Hash_node_base *)0x0) {
    local_4c = false;
  }
  else {
    local_4c = false;
    do {
      object_t::select_message((object_t *)p_Var4[1]._M_nxt);
      plVar3 = local_40;
      if (local_40 != (long *)0x0) {
        do {
          local_40 = (long *)0x0;
          local_48 = plVar3;
          (*runtime_t::instance::value.super_callbacks._vptr_callbacks[2])
                    (&runtime_t::instance::value,p_Var4[1]._M_nxt,&local_48);
          if (local_48 != (long *)0x0) {
            (**(code **)(*local_48 + 8))();
          }
          local_48 = (long *)0x0;
          if (local_40 != (long *)0x0) {
            (**(code **)(*local_40 + 8))();
          }
          object_t::select_message((object_t *)p_Var4[1]._M_nxt);
          plVar3 = local_40;
        } while (local_40 != (long *)0x0);
        local_4c = true;
      }
      p_Var1 = p_Var4[1]._M_nxt;
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)(p_Var1 + 1));
      if (iVar2 != 0) {
        std::__throw_system_error(iVar2);
      }
      *(byte *)&p_Var4[1]._M_nxt[0xc]._M_nxt = *(byte *)&p_Var4[1]._M_nxt[0xc]._M_nxt & 0xf7;
      pthread_mutex_unlock((pthread_mutex_t *)(p_Var1 + 1));
      if (need_delete) {
        runtime_t::deconstruct_object(&runtime_t::instance::value,(object_t *)p_Var4[1]._M_nxt);
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  if (need_delete) {
    this_00 = &local_38->actors;
    for (p_Var4 = (local_38->actors)._M_h._M_before_begin._M_nxt; p_Var4 != (_Hash_node_base *)0x0;
        p_Var4 = p_Var4->_M_nxt) {
      runtime_t::release(&runtime_t::instance::value,(object_t *)p_Var4[1]._M_nxt);
    }
    std::
    _Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&this_00->_M_h);
  }
  return local_4c;
}

Assistant:

bool process_actors(const bool need_delete) {
    auto runtime = runtime_t::instance();
    bool something_was_processed = false;
    // TODO: - switch between active actors to balance message processing.
    //       - detect message loop.
    for (auto ai = actors.cbegin(); ai != actors.cend(); ++ai) {
      while (auto msg = (*ai)->select_message()) {
        runtime->handle_message(*ai, std::move(msg));
        something_was_processed = true;
      }
      {
        std::lock_guard<std::mutex> g((*ai)->cs);
        (*ai)->scheduled = false;
      }
      if (need_delete) {
        runtime->deconstruct_object(*ai);
      }
    }

    if (need_delete) {
      for (auto ai = actors.cbegin(); ai != actors.cend(); ++ai) {
        runtime->release(*ai);
      }

      actors.clear();
    }

    return something_was_processed;
  }